

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

Mio_Cell_t * Mio_CollectRootsNew(Mio_Library_t *pLib,int nInputs,int *pnGates,int fVerbose)

{
  int *piVar1;
  byte *pbVar2;
  uint uVar3;
  word wVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Mio_Cell_t *pMVar8;
  Mio_Gate_t *pMVar9;
  Mio_Cell_t *pMVar10;
  float *pfVar11;
  Mio_Pin_t *pMVar12;
  uint *puVar13;
  void *__ptr;
  ulong uVar14;
  ulong uVar15;
  float *pfVar16;
  word *pwVar17;
  char *__s;
  int iVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  
  iVar6 = Mio_LibraryReadGateNum(pLib);
  pMVar8 = (Mio_Cell_t *)calloc((long)(iVar6 + 4),0x30);
  pMVar9 = Mio_LibraryReadGates(pLib);
  if (pMVar9 != (Mio_Gate_t *)0x0) {
    uVar19 = 4;
    do {
      iVar18 = pMVar9->nInputs;
      if ((iVar18 <= nInputs) && (pMVar9->pTwin == (Mio_Gate_t *)0x0)) {
        iVar7 = (int)uVar19;
        if (0 < iVar7) {
          uVar14 = 0;
          pfVar11 = pMVar8->Delays;
LAB_003de8dd:
          if ((pMVar8[uVar14].pName == (char *)0x0) ||
             (pMVar10 = pMVar8 + uVar14, pMVar10->uTruth != (pMVar9->field_15).uTruth))
          goto LAB_003de8fd;
          if ((float)pMVar9->dArea + 0.0094636 < pMVar10->Area) goto LAB_003dea89;
          if ((float)pMVar9->dArea + -0.0094636 <= pMVar10->Area) {
            uVar3 = *(uint *)&pMVar10->field_0x8;
            uVar14 = (ulong)(uVar3 >> 0x1c);
            fVar20 = 0.0;
            pfVar16 = pfVar11;
            if (0xfffffff < uVar3) {
              do {
                fVar20 = fVar20 + *pfVar16;
                uVar14 = uVar14 - 1;
                pfVar16 = pfVar16 + 1;
              } while (uVar14 != 0);
            }
            if (0xfffffff < uVar3) {
              fVar20 = fVar20 / (float)(uVar3 >> 0x1c);
            }
            pMVar12 = Mio_GateReadPins(pMVar9);
            fVar21 = 0.0;
            for (; pMVar12 != (Mio_Pin_t *)0x0; pMVar12 = Mio_PinReadNext(pMVar12)) {
              fVar21 = fVar21 + (float)(pMVar12->dDelayBlockRise * 0.5 +
                                       pMVar12->dDelayBlockFall * 0.5);
            }
            iVar18 = pMVar9->nInputs;
            if (iVar18 != 0) {
              fVar21 = fVar21 / (float)iVar18;
            }
            if (fVar21 + 0.0094636 < fVar20) {
LAB_003dea89:
              pMVar10->pName = pMVar9->pName;
              pMVar10->uTruth = (word)pMVar9->field_15;
              pMVar10->Area = (float)pMVar9->dArea;
              *(uint *)&pMVar10->field_0x8 =
                   *(uint *)&pMVar10->field_0x8 & 0xfffffff | iVar18 << 0x1c;
              for (pMVar12 = pMVar9->pPins; pMVar12 != (Mio_Pin_t *)0x0; pMVar12 = pMVar12->pNext) {
                *pfVar11 = (float)(pMVar12->dDelayBlockRise * 0.5 + pMVar12->dDelayBlockFall * 0.5);
                pfVar11 = pfVar11 + 1;
              }
              goto LAB_003de8af;
            }
            if (fVar21 + -0.0094636 <= fVar20) {
              iVar7 = strcmp(pMVar10->pName,pMVar9->pName);
              if (0 < iVar7) goto LAB_003dea89;
              if (-1 < iVar7) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                              ,0x1fe,"int Mio_CompareTwo(Mio_Cell_t *, Mio_Gate_t *)");
              }
            }
          }
          goto LAB_003de8af;
        }
LAB_003de909:
        wVar4 = (pMVar9->field_15).uTruth;
        if (wVar4 + 1 < 2) {
          if (iVar18 != 0) {
            __assert_fail("pGate->nInputs == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x227,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
          uVar14 = (ulong)((uint)(wVar4 == 0xffffffffffffffff) * 0x30);
          *(char **)((long)pMVar8->Delays + (uVar14 - 0x18)) = pMVar9->pName;
          *(anon_union_8_2_ab88de1c_for_Mio_GateStruct_t__15 *)((long)pMVar8->Delays + (uVar14 - 8))
               = pMVar9->field_15;
          *(float *)((long)pMVar8->Delays + (uVar14 - 0xc)) = (float)pMVar9->dArea;
          pbVar2 = (byte *)((long)pMVar8->Delays + (uVar14 - 0xd));
          *pbVar2 = *pbVar2 & 0xf;
          pMVar12 = pMVar9->pPins;
          if (pMVar12 != (Mio_Pin_t *)0x0) {
            pfVar11 = (float *)((long)pMVar8->Delays + uVar14);
            do {
              *pfVar11 = (float)(pMVar12->dDelayBlockRise * 0.5 + pMVar12->dDelayBlockFall * 0.5);
              pMVar12 = pMVar12->pNext;
              pfVar11 = pfVar11 + 1;
            } while (pMVar12 != (Mio_Pin_t *)0x0);
          }
        }
        else if ((wVar4 == 0xaaaaaaaaaaaaaaaa) || (wVar4 == 0x5555555555555555)) {
          if (iVar18 != 1) {
            __assert_fail("pGate->nInputs == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x22e,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
          pMVar10 = pMVar8 + 2;
          if (wVar4 == 0x5555555555555555) {
            pMVar10 = pMVar8 + 3;
          }
          pMVar10->pName = pMVar9->pName;
          pMVar10->uTruth = (word)pMVar9->field_15;
          pMVar10->Area = (float)pMVar9->dArea;
          *(uint *)&pMVar10->field_0x8 = *(uint *)&pMVar10->field_0x8 & 0xfffffff | 0x10000000;
          pMVar12 = pMVar9->pPins;
          if (pMVar12 != (Mio_Pin_t *)0x0) {
            pfVar11 = pMVar10->Delays;
            do {
              *pfVar11 = (float)(pMVar12->dDelayBlockRise * 0.5 + pMVar12->dDelayBlockFall * 0.5);
              pMVar12 = pMVar12->pNext;
              pfVar11 = pfVar11 + 1;
            } while (pMVar12 != (Mio_Pin_t *)0x0);
          }
        }
        else {
          uVar19 = (ulong)(iVar7 + 1);
          pMVar8[iVar7].pName = pMVar9->pName;
          pMVar8[iVar7].uTruth = (word)pMVar9->field_15;
          pMVar8[iVar7].Area = (float)pMVar9->dArea;
          *(uint *)&pMVar8[iVar7].field_0x8 =
               *(uint *)&pMVar8[iVar7].field_0x8 & 0xfffffff | iVar18 << 0x1c;
          pMVar12 = pMVar9->pPins;
          if (pMVar12 != (Mio_Pin_t *)0x0) {
            pfVar11 = pMVar8[iVar7].Delays;
            do {
              *pfVar11 = (float)(pMVar12->dDelayBlockRise * 0.5 + pMVar12->dDelayBlockFall * 0.5);
              pMVar12 = pMVar12->pNext;
              pfVar11 = pfVar11 + 1;
            } while (pMVar12 != (Mio_Pin_t *)0x0);
          }
        }
      }
LAB_003de8af:
      pMVar9 = Mio_GateReadNext(pMVar9);
    } while (pMVar9 != (Mio_Gate_t *)0x0);
    if (pMVar8->pName != (char *)0x0) {
      if (pMVar8[1].pName != (char *)0x0) {
        if (pMVar8[2].pName == (char *)0x0) {
          __s = "Error: Cannot find buffer gate in the library.";
          goto LAB_003ded62;
        }
        if (pMVar8[3].pName == (char *)0x0) {
          __s = "Error: Cannot find inverter gate in the library.";
          goto LAB_003ded62;
        }
        iVar18 = (int)uVar19;
        if (iVar18 < 6) {
          if (iVar18 < 1) {
            bVar5 = false;
            goto LAB_003dedd6;
          }
        }
        else {
          qsort(pMVar8 + 4,(ulong)(iVar18 - 4),0x30,Mio_AreaCompare);
          iVar7 = Mio_AreaCompare(pMVar8 + 4,pMVar8 + (uVar19 - 1));
          if (0 < iVar7) {
            __assert_fail("Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x241,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
        }
        puVar13 = (uint *)&pMVar8->field_0x8;
        uVar14 = 0;
        do {
          uVar3 = (uint)uVar14 & 0xfffffff;
          if (*(long *)(puVar13 + -2) == 0) {
            uVar3 = 0xfffffff;
          }
          *puVar13 = *puVar13 & 0xf0000000 | uVar3;
          uVar14 = uVar14 + 1;
          puVar13 = puVar13 + 0xc;
        } while (uVar19 != uVar14);
        bVar5 = true;
LAB_003dedd6:
        if (fVerbose != 0) {
          __ptr = calloc((long)(iVar6 + 4),4);
          pMVar9 = Mio_LibraryReadGates(pLib);
          if (pMVar9 != (Mio_Gate_t *)0x0) {
            do {
              if ((pMVar9->nInputs <= nInputs) && (pMVar9->pTwin == (Mio_Gate_t *)0x0)) {
                if (!bVar5) {
LAB_003def2d:
                  __assert_fail("i < iCell",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                                ,0x256,
                                "Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)")
                  ;
                }
                uVar14 = 0;
                pwVar17 = &pMVar8->uTruth;
                while ((((Mio_Cell_t *)(pwVar17 + -2))->pName == (char *)0x0 ||
                       (*pwVar17 != (pMVar9->field_15).uTruth))) {
                  uVar14 = uVar14 + 1;
                  pwVar17 = pwVar17 + 6;
                  if (uVar19 == uVar14) goto LAB_003def2d;
                }
                piVar1 = (int *)((long)__ptr + uVar14 * 4);
                *piVar1 = *piVar1 + 1;
              }
              pMVar9 = Mio_GateReadNext(pMVar9);
            } while (pMVar9 != (Mio_Gate_t *)0x0);
          }
          if (bVar5) {
            pfVar11 = pMVar8->Delays;
            uVar14 = 0;
            do {
              printf("%4d : ",uVar14 & 0xffffffff);
              if (pMVar8[uVar14].pName == (char *)0x0) {
                puts("None");
              }
              else {
                uVar3 = *(uint *)&pMVar8[uVar14].field_0x8;
                fVar20 = 0.0;
                if (0xfffffff < uVar3) {
                  uVar15 = 0;
                  do {
                    fVar20 = fVar20 + pfVar11[uVar15];
                    uVar15 = uVar15 + 1;
                  } while (uVar3 >> 0x1c != uVar15);
                }
                if (0xfffffff < uVar3) {
                  fVar20 = fVar20 / (float)(uVar3 >> 0x1c);
                }
                printf("%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n",
                       (double)pMVar8[uVar14].Area,(double)fVar20);
              }
              uVar14 = uVar14 + 1;
              pfVar11 = pfVar11 + 0xc;
            } while (uVar14 != uVar19);
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        if (pnGates == (int *)0x0) {
          return pMVar8;
        }
        *pnGates = iVar18;
        return pMVar8;
      }
      __s = "Error: Cannot find constant 1 gate in the library.";
      goto LAB_003ded62;
    }
  }
  __s = "Error: Cannot find constant 0 gate in the library.";
LAB_003ded62:
  puts(__s);
  return (Mio_Cell_t *)0x0;
LAB_003de8fd:
  uVar14 = uVar14 + 1;
  pfVar11 = pfVar11 + 0xc;
  if (uVar14 == uVar19) goto LAB_003de909;
  goto LAB_003de8dd;
}

Assistant:

Mio_Cell_t * Mio_CollectRootsNew( Mio_Library_t * pLib, int nInputs, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate;
    Mio_Cell_t * ppCells;
    int i, nGates, iCell = 4;
    nGates = Mio_LibraryReadGateNum( pLib );
    ppCells = ABC_CALLOC( Mio_Cell_t, nGates + 4 );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with smaller average pin delay
    // if these are also equal, select lexicographically smaller name
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
            continue;
        // check if the gate with this functionality already exists
        for ( i = 0; i < iCell; i++ )
            if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
            {
                if ( Mio_CompareTwo( ppCells + i, pGate ) )
                    Mio_CollectCopy( ppCells + i, pGate );
                break;
            }
        if ( i < iCell )
            continue;
        if ( pGate->uTruth == 0 || pGate->uTruth == ~(word)0 )
        {
            int Idx = (int)(pGate->uTruth == ~(word)0);
            assert( pGate->nInputs == 0 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        if ( pGate->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) || pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) )
        {
            int Idx = 2 + (int)(pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA));
            assert( pGate->nInputs == 1 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        Mio_CollectCopy( ppCells + iCell++, pGate );
    }
    if ( ppCells[0].pName == NULL )
        { printf( "Error: Cannot find constant 0 gate in the library.\n" ); return NULL; }
    if ( ppCells[1].pName == NULL )
        { printf( "Error: Cannot find constant 1 gate in the library.\n" ); return NULL; }
    if ( ppCells[2].pName == NULL )
        { printf( "Error: Cannot find buffer gate in the library.\n" );     return NULL; }
    if ( ppCells[3].pName == NULL )
        { printf( "Error: Cannot find inverter gate in the library.\n" );   return NULL; }
    // sort by delay
    if ( iCell > 5 ) 
    {
        qsort( (void *)(ppCells + 4), (size_t)(iCell - 4), sizeof(Mio_Cell_t), 
                (int (*)(const void *, const void *)) Mio_AreaCompare );
        assert( Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0 );
    }
    // assign IDs
    for ( i = 0; i < iCell; i++ )
        ppCells[i].Id = ppCells[i].pName ? i : -1;

    // report
    if ( fVerbose )
    {
        // count gates
        int * pCounts = ABC_CALLOC( int, nGates + 4 );
        Mio_LibraryForEachGate( pLib, pGate )
        {
            if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
                continue;
            for ( i = 0; i < iCell; i++ )
                if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
                {
                    pCounts[i]++;
                    break;
                }
            assert( i < iCell );
        }
        for ( i = 0; i < iCell; i++ )
        {
            Mio_Cell_t * pCell = ppCells + i;
            printf( "%4d : ", i );
            if ( pCell->pName == NULL )
                printf( "None\n" );
            else
                printf( "%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n", 
                    pCell->pName, pCell->nFanins, pCounts[i], pCell->Area, Mio_CellDelayAve(pCell) );
        }
        ABC_FREE( pCounts );
    }
    if ( pnGates )
        *pnGates = iCell;
    return ppCells;
}